

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakF-1600-opt64.c
# Opt level: O0

void KeccakExtract(uchar *state,uchar *data,uint laneCount)

{
  uint in_EDX;
  void *in_RSI;
  void *in_RDI;
  
  memcpy(in_RSI,in_RDI,(ulong)(in_EDX << 3));
  if ((((1 < in_EDX) &&
       (*(ulong *)((long)in_RSI + 8) = *(ulong *)((long)in_RSI + 8) ^ 0xffffffffffffffff, 2 < in_EDX
       )) && (*(ulong *)((long)in_RSI + 0x10) = *(ulong *)((long)in_RSI + 0x10) ^ 0xffffffffffffffff
             , 8 < in_EDX)) &&
     (((*(ulong *)((long)in_RSI + 0x40) = *(ulong *)((long)in_RSI + 0x40) ^ 0xffffffffffffffff,
       0xc < in_EDX &&
       (*(ulong *)((long)in_RSI + 0x60) = *(ulong *)((long)in_RSI + 0x60) ^ 0xffffffffffffffff,
       0x11 < in_EDX)) &&
      (*(ulong *)((long)in_RSI + 0x88) = *(ulong *)((long)in_RSI + 0x88) ^ 0xffffffffffffffff,
      0x14 < in_EDX)))) {
    *(ulong *)((long)in_RSI + 0xa0) = *(ulong *)((long)in_RSI + 0xa0) ^ 0xffffffffffffffff;
  }
  return;
}

Assistant:

static void KeccakExtract(const unsigned char *state, unsigned char *data, unsigned int laneCount)
{
#if (PLATFORM_BYTE_ORDER == IS_LITTLE_ENDIAN)
    memcpy(data, state, laneCount*8);
#else
    unsigned int i;

    for(i=0; i<laneCount; i++)
        fromWordToBytes(data+(i*8), ((const UINT64*)state)[i]);
#endif
#ifdef UseBebigokimisa
    if (laneCount > 1) {
        ((UINT64*)data)[ 1] = ~((UINT64*)data)[ 1];
        if (laneCount > 2) {
            ((UINT64*)data)[ 2] = ~((UINT64*)data)[ 2];
            if (laneCount > 8) {
                ((UINT64*)data)[ 8] = ~((UINT64*)data)[ 8];
                if (laneCount > 12) {
                    ((UINT64*)data)[12] = ~((UINT64*)data)[12];
                    if (laneCount > 17) {
                        ((UINT64*)data)[17] = ~((UINT64*)data)[17];
                        if (laneCount > 20) {
                            ((UINT64*)data)[20] = ~((UINT64*)data)[20];
                        }
                    }
                }
            }
        }
    }
#endif
}